

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O2

int lws_client_interpret_server_handshake(lws *wsi)

{
  byte *pbVar1;
  allocated_headers *paVar2;
  lws_dll2 *plVar3;
  allocated_headers *paVar4;
  ah_data_idx_t aVar5;
  int iVar6;
  lws *plVar7;
  char *pcVar8;
  lws_filepos_t lVar9;
  size_t sVar10;
  ulong uVar11;
  size_t len;
  uint ssl;
  char *pcVar12;
  lws_close_status reason;
  lws_role_ops *ops;
  lws_dll2 *d;
  bool bVar13;
  char *cce;
  int port;
  lws *wsi_local;
  char *path;
  char *ads;
  char *prot;
  
  port = 0;
  ads = (char *)0x0;
  cce = (char *)0x0;
  wsi_local = wsi;
  plVar7 = lws_get_network_wsi(wsi);
  lws_realloc(wsi->stash,0,"free");
  wsi->stash = (client_info_stash *)0x0;
  paVar2 = (wsi->http).ah;
  uVar11 = *(ulong *)&wsi->field_0x2dc;
  if ((uVar11 >> 0x2d & 1) == 0) {
    bVar13 = (uVar11 & 0xc0000000000000) == 0;
    pcVar12 = "%s: %p: transitioning to h2 client\n";
    if (bVar13) {
      pcVar12 = "%s: %p: transitioning to h1 client\n";
    }
    ops = &role_ops_h2;
    if (bVar13) {
      ops = &role_ops_h1;
    }
    _lws_log(0x10,pcVar12,"lws_client_interpret_server_handshake",wsi);
    lws_role_transition(wsi,0x10000000,LRS_ESTABLISHED,ops);
    (wsi->http).ah = paVar2;
    paVar2->http_response = 0;
    uVar11 = *(ulong *)&wsi->field_0x2dc;
  }
  (wsi->http).conn_type = HTTP_CONNECTION_KEEP_ALIVE;
  if ((uVar11 >> 0x37 & 1) == 0) {
    pcVar12 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP);
    if (pcVar12 == (char *)0x0) {
      pcVar12 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP1_0);
      (wsi->http).conn_type = HTTP_CONNECTION_CLOSE;
      if (pcVar12 == (char *)0x0) {
        cce = "HS: URI missing";
        pcVar12 = "no URI\n";
        goto LAB_00122745;
      }
    }
  }
  else {
    pcVar12 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_COLON_STATUS);
    if (pcVar12 == (char *)0x0) {
      cce = "HS: :status missing";
      pcVar12 = "no status\n";
LAB_00122745:
      reason = LWS_CLOSE_STATUS_NOSTATUS;
      _lws_log(8,pcVar12);
      goto LAB_001229d6;
    }
  }
  aVar5 = atoi(pcVar12);
  if (paVar2 != (allocated_headers *)0x0) {
    paVar2->http_response = aVar5;
  }
  uVar11 = *(ulong *)&wsi->field_0x2dc;
  if ((((uVar11 >> 0x3a & 1) != 0) || (7 < aVar5 - 0x12d)) ||
     ((199U >> (aVar5 - 0x12d & 0x1f) & 1) == 0)) {
    if ((uVar11 & 0x200000000000) == 0) {
      if ((uVar11 & 0xc0000000000000) == 0) {
        if ((wsi->http).conn_type == HTTP_CONNECTION_KEEP_ALIVE) {
          *(ulong *)&wsi->field_0x2dc = uVar11 | 0x4000000000000;
        }
        else {
          *(ulong *)&wsi->field_0x2dc = uVar11 | 0x8000000000000;
          d = (wsi->dll2_cli_txn_queue_owner).head;
          while (d != (lws_dll2 *)0x0) {
            plVar3 = d->next;
            lws_dll2_remove(d);
            pbVar1 = (byte *)((long)&d[0xb].owner + 2);
            *pbVar1 = *pbVar1 & 0xdf;
            lws_role_transition((lws *)(d + -0x13),0x10000000,LRS_UNCONNECTED,&role_ops_h1);
            d[6].owner = (lws_dll2_owner *)0x0;
            d = plVar3;
          }
        }
      }
      iVar6 = lws_ensure_user_space(wsi);
      if (iVar6 == 0) {
        wsi->field_0x2e1 = wsi->field_0x2e1 & 0xbf;
        wsi->chunk_remaining = 0;
        iVar6 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_TRANSFER_ENCODING);
        if (iVar6 != 0) {
          pcVar12 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_TRANSFER_ENCODING);
          iVar6 = strcmp(pcVar12,"chunked");
          uVar11 = 0;
          if (iVar6 == 0) {
            uVar11 = 0x400000000000;
          }
          *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffbfffffffffff | uVar11;
          wsi->chunk_parser = '\0';
        }
        iVar6 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
        if (iVar6 == 0) {
          if ((*(ulong *)&wsi->field_0x2dc & 0x400000000000) == 0) {
            (wsi->http).conn_type = HTTP_CONNECTION_CLOSE;
          }
        }
        else {
          pcVar12 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
          lVar9 = atoll(pcVar12);
          (wsi->http).rx_content_length = lVar9;
          _lws_log(8,"%s: incoming content length %llu\n","lws_client_interpret_server_handshake",
                   lVar9);
          (wsi->http).rx_content_remain = (wsi->http).rx_content_length;
        }
        paVar4 = (wsi->http).ah;
        (wsi->http).ah = paVar2;
        iVar6 = (*wsi->protocol->callback)
                          (wsi,LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,wsi->user_space,(void *)0x0,
                           0);
        if (iVar6 == 0) {
          reason = LWS_CLOSE_STATUS_NOSTATUS;
          lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
          *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xffffffffffff9fff | 0x2000;
          iVar6 = (*wsi->protocol->callback)
                            (wsi,LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP,wsi->user_space,(void *)0x0,0)
          ;
          (wsi->http).ah = paVar4;
          if (iVar6 == 0) {
            _lws_log(8,"%s: client connection up\n","lws_client_interpret_server_handshake");
            iVar6 = lws_hdr_total_length(wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH);
            if (iVar6 == 0) {
              return 0;
            }
            if ((wsi->http).rx_content_length == 0) {
              iVar6 = lws_http_transaction_completed_client(wsi);
              return (uint)(iVar6 != 0);
            }
            return 0;
          }
          cce = "HS: disallowed at ESTABLISHED";
          goto LAB_001229d6;
        }
        (wsi->http).ah = paVar4;
        cce = "HS: disallowed by client filter";
      }
      else {
        _lws_log(1,"Problem allocating wsi user mem\n");
        cce = "HS: OOM";
      }
    }
    else {
      iVar6 = lws_client_ws_upgrade(wsi,&cce);
      if (iVar6 != 2) {
        if (iVar6 != 3) {
          return 0;
        }
        goto LAB_001229d3;
      }
    }
    reason = LWS_CLOSE_STATUS_PROTOCOL_ERR;
    goto LAB_001229d6;
  }
  pcVar12 = lws_hdr_simple_ptr(wsi,WSI_TOKEN_HTTP_LOCATION);
  if (pcVar12 == (char *)0x0) {
    cce = "HS: Redirect code but no Location";
  }
  else {
    if (aVar5 == 0x12f) {
      pcVar8 = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
      iVar6 = lws_hdr_total_length(wsi,_WSI_TOKEN_CLIENT_METHOD);
      if (pcVar8 != (char *)0x0 && 2 < iVar6) {
        _lws_log(8,"%s: 303 switching to GET\n","lws_client_interpret_server_handshake");
        builtin_strncpy(pcVar8,"GET",4);
        wsi->field_0x2e2 = wsi->field_0x2e2 | 0x10;
        paVar2 = (wsi->http).ah;
        paVar2->frags[paVar2->frag_index[0x5c]].len = 3;
      }
    }
    if ((*pcVar12 == '/') || (pcVar8 = strchr(pcVar12,0x3a), pcVar8 == (char *)0x0)) {
      ssl = (plVar7->tls).use_ssl & 1;
      ads = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_PEER_ADDRESS);
      port = (int)plVar7->c_port;
      path = pcVar12;
      if (*pcVar12 == '/') {
        path = pcVar12 + 1;
      }
    }
    else {
      iVar6 = lws_parse_uri(pcVar12,&prot,&ads,&port,&path);
      if (iVar6 != 0) {
        cce = "HS: URI did not parse";
        goto LAB_001229d3;
      }
      iVar6 = strcmp(prot,"wss");
      if (iVar6 != 0) {
        iVar6 = strcmp(prot,"https");
        ssl = 0;
        if (iVar6 != 0) goto LAB_00122790;
      }
      ssl = 1;
    }
LAB_00122790:
    if ((((wsi->tls).use_ssl & 1) == 0) || (ssl != 0)) {
      if (ads != (char *)0x0) {
        plVar7 = lws_client_reset(&wsi_local,ssl,ads,port,path,ads,'\x01');
        if (plVar7 != (lws *)0x0) {
          return 0;
        }
        reason = LWS_CLOSE_STATUS_NOSTATUS;
        _lws_log(1,"Redirect failed\n");
        cce = "HS: Redirect failed";
        wsi = wsi_local;
        if (wsi_local == (lws *)0x0) {
          return 1;
        }
        goto LAB_001229d6;
      }
      cce = "no ads";
    }
    else {
      cce = "HS: Redirect attempted SSL downgrade";
    }
  }
LAB_001229d3:
  reason = LWS_CLOSE_STATUS_NOSTATUS;
LAB_001229d6:
  pcVar8 = cce;
  pcVar12 = "unknown";
  if (wsi->protocol != (lws_protocols *)0x0) {
    if (cce == (char *)0x0) {
      len = 0;
    }
    else {
      sVar10 = strlen(cce);
      len = sVar10 & 0xffffffff;
    }
    lws_inform_client_conn_fail(wsi,pcVar8,len);
    if (wsi_local->protocol != (lws_protocols *)0x0) {
      pcVar12 = wsi_local->protocol->name;
    }
  }
  _lws_log(8,"closing connection (prot %s) due to bail2 connection error: %s\n",pcVar12,cce);
  lws_close_free_wsi(wsi_local,reason,"c hs interp");
  return 1;
}

Assistant:

int
lws_client_interpret_server_handshake(struct lws *wsi)
{
	int n, port = 0, ssl = 0;
	int close_reason = LWS_CLOSE_STATUS_PROTOCOL_ERR;
	const char *prot, *ads = NULL, *path, *cce = NULL;
	struct allocated_headers *ah, *ah1;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	char *p, *q;
	char new_path[300];

	lws_free_set_NULL(wsi->stash);

	ah = wsi->http.ah;
	if (!wsi->do_ws) {
		/* we are being an http client...
		 */
#if defined(LWS_ROLE_H2)
		if (wsi->client_h2_alpn || wsi->client_mux_substream) {
			lwsl_debug("%s: %p: transitioning to h2 client\n",
				   __func__, wsi);
			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_ESTABLISHED, &role_ops_h2);
		} else
#endif
		{
#if defined(LWS_ROLE_H1)
			{
			lwsl_debug("%s: %p: transitioning to h1 client\n",
				   __func__, wsi);
			lws_role_transition(wsi, LWSIFR_CLIENT,
					    LRS_ESTABLISHED, &role_ops_h1);
			}
#else
			return -1;
#endif
		}

		wsi->http.ah = ah;
		ah->http_response = 0;
	}

	/*
	 * well, what the server sent looked reasonable for syntax.
	 * Now let's confirm it sent all the necessary headers
	 *
	 * http (non-ws) client will expect something like this
	 *
	 * HTTP/1.0.200
	 * server:.libwebsockets
	 * content-type:.text/html
	 * content-length:.17703
	 * set-cookie:.test=LWS_1456736240_336776_COOKIE;Max-Age=360000
	 */

	wsi->http.conn_type = HTTP_CONNECTION_KEEP_ALIVE;
	if (!wsi->client_mux_substream) {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP);
		/*
		if (wsi->do_ws && !p) {
			lwsl_info("no URI\n");
			cce = "HS: URI missing";
			goto bail3;
		}
		*/
		if (!p) {
			p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP1_0);
			wsi->http.conn_type = HTTP_CONNECTION_CLOSE;
		}
		if (!p) {
			cce = "HS: URI missing";
			lwsl_info("no URI\n");
			goto bail3;
		}
	} else {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_COLON_STATUS);
		if (!p) {
			cce = "HS: :status missing";
			lwsl_info("no status\n");
			goto bail3;
		}
	}
	n = atoi(p);
	if (ah)
		ah->http_response = n;

	if (!wsi->client_no_follow_redirect &&
#if defined(LWS_WITH_HTTP_PROXY)
	    !wsi->http.proxy_clientside &&
#endif
	    (n == 301 || n == 302 || n == 303 || n == 307 || n == 308)) {
		p = lws_hdr_simple_ptr(wsi, WSI_TOKEN_HTTP_LOCATION);
		if (!p) {
			cce = "HS: Redirect code but no Location";
			goto bail3;
		}

		/*
		 * Some redirect codes imply we have to change the method
		 * used for the subsequent transaction, commonly POST ->
		 * 303 -> GET.
		 */

		if (n == 303) {
			char *mp = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
			int ml = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_METHOD);

			if (ml >= 3 && mp) {
				lwsl_info("%s: 303 switching to GET\n", __func__);
				memcpy(mp, "GET", 4);
				wsi->redirected_to_get = 1;
				wsi->http.ah->frags[wsi->http.ah->frag_index[
				             _WSI_TOKEN_CLIENT_METHOD]].len = 3;
			}
		}

		/* Relative reference absolute path */
		if (p[0] == '/' || !strchr(p, ':')) {
#if defined(LWS_WITH_TLS)
			ssl = nwsi->tls.use_ssl & LCCSCF_USE_SSL;
#endif
			ads = lws_hdr_simple_ptr(wsi,
						 _WSI_TOKEN_CLIENT_PEER_ADDRESS);
			port = nwsi->c_port;
			path = p;
			/* lws_client_reset expects leading / omitted */
			if (*path == '/')
				path++;
		}
		/* Absolute (Full) URI */
		else if (strchr(p, ':')) {
			if (lws_parse_uri(p, &prot, &ads, &port, &path)) {
				cce = "HS: URI did not parse";
				goto bail3;
			}

			if (!strcmp(prot, "wss") || !strcmp(prot, "https"))
				ssl = LCCSCF_USE_SSL;
		}
		/* Relative reference relative path */
		else {
			/* This doesn't try to calculate an absolute path,
			 * that will be left to the server */
#if defined(LWS_WITH_TLS)
			ssl = nwsi->tls.use_ssl & LCCSCF_USE_SSL;
#endif
			ads = lws_hdr_simple_ptr(wsi,
						 _WSI_TOKEN_CLIENT_PEER_ADDRESS);
			port = wsi->c_port;
			/* +1 as lws_client_reset expects leading / omitted */
			path = new_path + 1;
			if (lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI))
				lws_strncpy(new_path, lws_hdr_simple_ptr(wsi,
				   _WSI_TOKEN_CLIENT_URI), sizeof(new_path));
			else {
				new_path[0] = '/';
				new_path[1] = '\0';
			}
			q = strrchr(new_path, '/');
			if (q)
				lws_strncpy(q + 1, p, sizeof(new_path) -
							(q - new_path) - 1);
			else
				path = p;
		}

#if defined(LWS_WITH_TLS)
		if ((wsi->tls.use_ssl & LCCSCF_USE_SSL) && !ssl) {
			cce = "HS: Redirect attempted SSL downgrade";
			goto bail3;
		}
#endif

		if (!ads) /* make coverity happy */ {
			cce = "no ads";
			goto bail3;
		}

		if (!lws_client_reset(&wsi, ssl, ads, port, path, ads, 1)) {
			/*
			 * There are two ways to fail out with NULL return...
			 * simple, early problem where the wsi is intact, or
			 * we went through with the reconnect attempt and the
			 * wsi is already closed.  In the latter case, the wsi
			 * has been set to NULL additionally.
			 */
			lwsl_err("Redirect failed\n");
			cce = "HS: Redirect failed";
			/* coverity[reverse_inull] */
			if (wsi)
				goto bail3;

			/* wsi has closed */
			return 1;
		}
		return 0;
	}

	if (!wsi->do_ws) {

		/* if h1 KA is allowed, enable the queued pipeline guys */

		if (!wsi->client_h2_alpn && !wsi->client_mux_substream) {
			/* ie, coming to this for the first time */
			if (wsi->http.conn_type == HTTP_CONNECTION_KEEP_ALIVE)
				wsi->keepalive_active = 1;
			else {
				/*
				 * Ugh... now the main http connection has seen
				 * both sides, we learn the server doesn't
				 * support keepalive.
				 *
				 * That means any guys queued on us are going
				 * to have to be restarted from connect2 with
				 * their own connections.
				 */

				/*
				 * stick around telling any new guys they can't
				 * pipeline to this server
				 */
				wsi->keepalive_rejected = 1;

				lws_vhost_lock(wsi->vhost);
				lws_start_foreach_dll_safe(struct lws_dll2 *,
							   d, d1,
				  wsi->dll2_cli_txn_queue_owner.head) {
					struct lws *ww = lws_container_of(d,
						struct lws,
						dll2_cli_txn_queue);

					/* remove him from our queue */
					lws_dll2_remove(&ww->dll2_cli_txn_queue);
					/* give up on pipelining */
					ww->client_pipeline = 0;

					/* go back to "trying to connect" state */
					lws_role_transition(ww, LWSIFR_CLIENT,
							    LRS_UNCONNECTED,
#if defined(LWS_ROLE_H1)
							    &role_ops_h1);
#else
#if defined (LWS_ROLE_H2)
							    &role_ops_h2);
#else
							    &role_ops_raw);
#endif
#endif
					ww->user_space = NULL;
				} lws_end_foreach_dll_safe(d, d1);
				lws_vhost_unlock(wsi->vhost);
			}
		}

#ifdef LWS_WITH_HTTP_PROXY
		wsi->http.perform_rewrite = 0;
		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE)) {
			if (!strncmp(lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_CONTENT_TYPE),
						"text/html", 9))
				wsi->http.perform_rewrite = 0;
		}
#endif

		/* allocate the per-connection user memory (if any) */
		if (lws_ensure_user_space(wsi)) {
			lwsl_err("Problem allocating wsi user mem\n");
			cce = "HS: OOM";
			goto bail2;
		}

		/* he may choose to send us stuff in chunked transfer-coding */
		wsi->chunked = 0;
		wsi->chunk_remaining = 0; /* ie, next thing is chunk size */
		if (lws_hdr_total_length(wsi,
					WSI_TOKEN_HTTP_TRANSFER_ENCODING)) {
			wsi->chunked = !strcmp(lws_hdr_simple_ptr(wsi,
					       WSI_TOKEN_HTTP_TRANSFER_ENCODING),
						"chunked");
			/* first thing is hex, after payload there is crlf */
			wsi->chunk_parser = ELCP_HEX;
		}

		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH)) {
			wsi->http.rx_content_length =
					atoll(lws_hdr_simple_ptr(wsi,
						WSI_TOKEN_HTTP_CONTENT_LENGTH));
			lwsl_info("%s: incoming content length %llu\n",
				    __func__, (unsigned long long)
					    wsi->http.rx_content_length);
			wsi->http.rx_content_remain =
					wsi->http.rx_content_length;
		} else /* can't do 1.1 without a content length or chunked */
			if (!wsi->chunked)
				wsi->http.conn_type = HTTP_CONNECTION_CLOSE;

		/*
		 * we seem to be good to go, give client last chance to check
		 * headers and OK it
		 */
		ah1 = wsi->http.ah;
		wsi->http.ah = ah;
		if (wsi->protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH,
					    wsi->user_space, NULL, 0)) {
			wsi->http.ah = ah1;
			cce = "HS: disallowed by client filter";
			goto bail2;
		}

		/* clear his proxy connection timeout */
		lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

		wsi->rxflow_change_to = LWS_RXFLOW_ALLOW;

		/* call him back to inform him he is up */
		if (wsi->protocol->callback(wsi,
					    LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP,
					    wsi->user_space, NULL, 0)) {
			wsi->http.ah = ah1;
			cce = "HS: disallowed at ESTABLISHED";
			goto bail3;
		}

		wsi->http.ah = ah1;

		lwsl_info("%s: client connection up\n", __func__);

		/*
		 * Did we get a response from the server with an explicit
		 * content-length of zero?  If so, this transaction is already
		 * completed at the end of the header processing...
		 */
		if (lws_hdr_total_length(wsi, WSI_TOKEN_HTTP_CONTENT_LENGTH) &&
		    !wsi->http.rx_content_length)
		        return !!lws_http_transaction_completed_client(wsi);

		return 0;
	}

#if defined(LWS_ROLE_WS)
	switch (lws_client_ws_upgrade(wsi, &cce)) {
	case 2:
		goto bail2;
	case 3:
		goto bail3;
	}

	return 0;
#endif

bail3:
	close_reason = LWS_CLOSE_STATUS_NOSTATUS;

bail2:
	if (wsi->protocol) {
		n = 0;
		if (cce)
			n = (int)strlen(cce);

		lws_inform_client_conn_fail(wsi, (void *)cce, (unsigned int)n);
	}

	lwsl_info("closing connection (prot %s) "
		  "due to bail2 connection error: %s\n", wsi->protocol ?
				  wsi->protocol->name : "unknown", cce);

	/* closing will free up his parsing allocations */
	lws_close_free_wsi(wsi, close_reason, "c hs interp");

	return 1;
}